

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception_thrower.hpp
# Opt level: O1

string * __thiscall
asd::detail::formatter<unsigned_long_const&>
          (string *__return_storage_ptr__,detail *this,char *fmt,unsigned_long *head)

{
  size_type *psVar1;
  undefined8 uVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  ulong uVar6;
  detail *__s;
  string str;
  ostringstream oss;
  allocator<char> local_221;
  _Alloc_hider local_220;
  size_type local_218;
  char local_210;
  undefined7 uStack_20f;
  undefined8 uStack_208;
  ulong *local_200;
  long local_1f8;
  ulong local_1f0;
  long lStack_1e8;
  ulong *local_1e0;
  long local_1d8;
  ulong local_1d0 [2];
  long *local_1c0 [2];
  long local_1b0 [2];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  local_218 = 0;
  local_210 = '\0';
  __s = this + 1;
  local_220._M_p = &local_210;
  do {
    if (__s[-1] == (detail)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (local_220._M_p == &local_210) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_20f,local_210);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_208;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_220._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_20f,local_210);
      }
      __return_storage_ptr__->_M_string_length = local_218;
      local_218 = 0;
      local_210 = '\0';
      local_220._M_p = &local_210;
LAB_00168db6:
      if (local_220._M_p != &local_210) {
        operator_delete(local_220._M_p,CONCAT71(uStack_20f,local_210) + 1);
      }
      return __return_storage_ptr__;
    }
    if (__s[-1] == (detail)0x25) {
      std::__cxx11::ostringstream::ostringstream(local_1a0);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
      std::__cxx11::stringbuf::str();
      plVar3 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_1c0,0,(char *)0x0,(ulong)local_220._M_p);
      puVar5 = (ulong *)(plVar3 + 2);
      if ((ulong *)*plVar3 == puVar5) {
        local_1f0 = *puVar5;
        lStack_1e8 = plVar3[3];
        local_200 = &local_1f0;
      }
      else {
        local_1f0 = *puVar5;
        local_200 = (ulong *)*plVar3;
      }
      local_1f8 = plVar3[1];
      *plVar3 = (long)puVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,(char *)__s,&local_221);
      uVar6 = 0xf;
      if (local_200 != &local_1f0) {
        uVar6 = local_1f0;
      }
      if (uVar6 < (ulong)(local_1d8 + local_1f8)) {
        uVar6 = 0xf;
        if (local_1e0 != local_1d0) {
          uVar6 = local_1d0[0];
        }
        if (uVar6 < (ulong)(local_1d8 + local_1f8)) goto LAB_00168ce8;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1e0,0,(char *)0x0,(ulong)local_200);
      }
      else {
LAB_00168ce8:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_200,(ulong)local_1e0);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar1 = puVar4 + 2;
      if ((size_type *)*puVar4 == psVar1) {
        uVar2 = puVar4[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
      }
      __return_storage_ptr__->_M_string_length = puVar4[1];
      *puVar4 = psVar1;
      puVar4[1] = 0;
      *(undefined1 *)psVar1 = 0;
      if (local_1e0 != local_1d0) {
        operator_delete(local_1e0,local_1d0[0] + 1);
      }
      if (local_200 != &local_1f0) {
        operator_delete(local_200,local_1f0 + 1);
      }
      if (local_1c0[0] != local_1b0) {
        operator_delete(local_1c0[0],local_1b0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(local_1a0);
      std::ios_base::~ios_base(local_130);
      goto LAB_00168db6;
    }
    std::__cxx11::string::push_back((char)&local_220);
    __s = __s + 1;
  } while( true );
}

Assistant:

std::string
formatter(const char* fmt, T&& head, Ts&& ... tail)
{
    std::string str;
    for(const char* i(fmt); *i != '\0'; ++i)
    {
        if(*i == '%')
        {
            std::ostringstream oss;
            oss << head;
            ++i;
            return str + oss.str() + formatter(i, std::forward<Ts>(tail)...);
        }
        else
        {
            str += *i;
        }
    }
    return str;
}